

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O2

unsigned_long __thiscall
o3dgc::BinaryStream::ReadUIntASCII(BinaryStream *this,unsigned_long *position)

{
  byte bVar1;
  unsigned_long uVar2;
  byte bVar3;
  unsigned_long uVar4;
  
  uVar4 = *position;
  *position = uVar4 + 1;
  uVar2 = (unsigned_long)(this->m_stream).m_buffer[uVar4];
  if (uVar2 == 0x7f) {
    uVar4 = uVar4 + 2;
    uVar2 = 0x7f;
    bVar3 = 0;
    do {
      *position = uVar4;
      bVar1 = (this->m_stream).m_buffer[uVar4 - 1];
      uVar2 = uVar2 + ((ulong)(bVar1 >> 1) << (bVar3 & 0x3f));
      bVar3 = bVar3 + 6;
      uVar4 = uVar4 + 1;
    } while ((bVar1 & 1) != 0);
  }
  return uVar2;
}

Assistant:

unsigned long           ReadUIntASCII(unsigned long & position) const
                                {
                                    unsigned long value = m_stream[position++];
                                    if (value == O3DGC_BINARY_STREAM_MAX_SYMBOL0)
                                    {
                                        long x;
                                        unsigned long i = 0;
                                        do
                                        {
                                            x = m_stream[position++];
                                            value += ( (x>>1) << i);
                                            i += O3DGC_BINARY_STREAM_BITS_PER_SYMBOL1;
                                        } while (x & 1);
                                    }
                                    return value;
                                }